

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_header.hpp
# Opt level: O0

bool __thiscall
ELFIO::elf_header_impl<ELFIO::Elf64_Ehdr>::load
          (elf_header_impl<ELFIO::Elf64_Ehdr> *this,istream *stream)

{
  address_translator *this_00;
  long lVar1;
  streampos local_38;
  streampos local_28;
  istream *local_18;
  istream *stream_local;
  elf_header_impl<ELFIO::Elf64_Ehdr> *this_local;
  
  this_00 = this->translator;
  local_18 = stream;
  stream_local = (istream *)this;
  std::fpos<__mbstate_t>::fpos(&local_38,0);
  local_28 = address_translator::operator[](this_00,local_38);
  std::istream::seekg(stream,local_28._M_off,local_28._M_state);
  std::istream::read((char *)local_18,(long)&this->header);
  lVar1 = std::istream::gcount();
  return lVar1 == 0x40;
}

Assistant:

bool load( std::istream& stream ) override
    {
        stream.seekg( ( *translator )[0] );
        stream.read( reinterpret_cast<char*>( &header ), sizeof( header ) );

        return ( stream.gcount() == sizeof( header ) );
    }